

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O2

int __thiscall
FFlatVertexBuffer::CreateSubsectorVertices
          (FFlatVertexBuffer *this,subsector_t *sub,secplane_t *plane,int floor)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  TArray<FFlatVertex,_FFlatVertex> *this_00;
  long lVar4;
  
  this_00 = &this->vbo_shadowdata;
  uVar1 = TArray<FFlatVertex,_FFlatVertex>::Reserve(this_00,sub->numlines);
  lVar4 = (long)(int)uVar1 * 0x14;
  lVar3 = 0;
  for (uVar2 = 0; uVar2 < sub->numlines; uVar2 = uVar2 + 1) {
    FFlatVertex::SetFlatVertex
              ((FFlatVertex *)((long)&this_00->Array->x + lVar4),
               *(vertex_t **)((long)&sub->firstline->v1 + lVar3),plane);
    if ((floor != 0) && (sub->sector->transdoor != false)) {
      *(float *)((long)&this_00->Array->z + lVar4) =
           *(float *)((long)&this_00->Array->z + lVar4) + -1.0;
    }
    lVar3 = lVar3 + 0x48;
    lVar4 = lVar4 + 0x14;
  }
  return uVar1 + (int)uVar2;
}

Assistant:

int FFlatVertexBuffer::CreateSubsectorVertices(subsector_t *sub, const secplane_t &plane, int floor)
{
	int idx = vbo_shadowdata.Reserve(sub->numlines);
	for(unsigned int k=0; k<sub->numlines; k++, idx++)
	{
		vbo_shadowdata[idx].SetFlatVertex(sub->firstline[k].v1, plane);
		if (sub->sector->transdoor && floor) vbo_shadowdata[idx].z -= 1.f;
	}
	return idx;
}